

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

DiffuseTransmissionMaterial *
pbrt::DiffuseTransmissionMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  Allocator alloc_00;
  bool bVar1;
  DiffuseTransmissionMaterial *pDVar2;
  undefined8 in_RCX;
  FloatTexture *in_RDI;
  Float scale;
  FloatTexture displacement;
  SpectrumTexture transmittance;
  SpectrumTexture reflectance;
  string *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  ConstantSpectrum **in_stack_fffffffffffffe78;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffe80;
  allocator<char> *args_3;
  FloatTexture *args_2;
  SpectrumTexture *args_1;
  FloatTexture *args;
  allocator<char> *in_stack_fffffffffffffea0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_141;
  string local_140 [8];
  string *in_stack_fffffffffffffec8;
  TextureParameterDictionary *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  SpectrumType in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  TextureParameterDictionary *in_stack_fffffffffffffef0;
  Allocator in_stack_fffffffffffffef8;
  allocator<char> local_b1;
  string local_b0 [32];
  TaggedPointer local_90 [12];
  undefined4 local_84;
  ConstantSpectrum *local_80;
  undefined8 local_70;
  undefined1 local_49 [33];
  TaggedPointer local_28 [24];
  FloatTexture *local_10;
  undefined8 local_8;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  local_10 = in_RDI;
  local_8 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,in_stack_fffffffffffffea0);
  Spectrum::TaggedPointer
            ((Spectrum *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  local_70 = local_8;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (Spectrum *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_28);
  if (!bVar1) {
    local_84 = 0x3e800000;
    local_80 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                         (in_stack_fffffffffffffe80,(float *)in_stack_fffffffffffffe78);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTexture *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SpectrumConstantTexture *)in_stack_fffffffffffffe68);
    SpectrumTexture::operator=
              ((SpectrumTexture *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SpectrumTexture *)in_stack_fffffffffffffe68);
  }
  __a = &local_b1;
  args = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  Spectrum::TaggedPointer
            ((Spectrum *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (Spectrum *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_90);
  if (!bVar1) {
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
              (in_stack_fffffffffffffe80,(float *)in_stack_fffffffffffffe78);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTexture *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SpectrumConstantTexture *)in_stack_fffffffffffffe68);
    SpectrumTexture::operator=
              ((SpectrumTexture *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SpectrumTexture *)in_stack_fffffffffffffe68);
  }
  args_1 = (SpectrumTexture *)&stack0xfffffffffffffef7;
  args_2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffedc;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffed8;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,alloc_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  args_3 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  TextureParameterDictionary::GetOneFloat
            ((TextureParameterDictionary *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
             ,0.0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  pDVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DiffuseTransmissionMaterial,pbrt::SpectrumTexture&,pbrt::SpectrumTexture&,pbrt::FloatTexture&,pbrt::Image*&,float&>
                     ((polymorphic_allocator<std::byte> *)__a,(SpectrumTexture *)args,args_1,args_2,
                      (Image **)args_3,(float *)local_10);
  return pDVar2;
}

Assistant:

DiffuseTransmissionMaterial *DiffuseTransmissionMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    SpectrumTexture reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Albedo, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.25f));

    SpectrumTexture transmittance = parameters.GetSpectrumTexture(
        "transmittance", nullptr, SpectrumType::Albedo, alloc);
    if (!transmittance)
        transmittance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.25f));

    FloatTexture displacement = parameters.GetFloatTextureOrNull("displacement", alloc);
    Float scale = parameters.GetOneFloat("scale", 1.f);

    return alloc.new_object<DiffuseTransmissionMaterial>(reflectance, transmittance,
                                                         displacement, normalMap, scale);
}